

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O2

void __thiscall tst_qpromise_map::preserveOrder(tst_qpromise_map *this)

{
  QSharedData *pQVar1;
  int *piVar2;
  bool bVar3;
  PromiseData<QList<int>_> *this_00;
  QPromiseReject<QList<int>_> *in_R8;
  initializer_list<int> args;
  initializer_list<int> args_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_e8;
  PromiseResolver<QList<int>_> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_d8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_d0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_c8;
  PromiseType p;
  QArrayDataPointer<int> local_b0;
  QArrayDataPointer<int> local_98;
  _Any_data local_80;
  undefined1 local_70;
  QArrayDataPointer<int> local_60;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  int local_24 [3];
  
  local_24[0] = 0xfa;
  local_24[1] = 500;
  local_24[2] = 100;
  args._M_len = 3;
  args._M_array = local_24;
  QList<int>::QList((QList<int> *)&local_60,args);
  QtPromise::resolve<QList<int>>((QtPromise *)&local_b0,(QList<int> *)&local_60);
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b030;
  this_00 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0
  ;
  *(undefined8 *)&(this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled
       = 0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (this_00->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QList<int>_>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d = (Data *)&PTR__QPromiseBase_0014b090;
  p.super_QPromiseBase<QList<int>_>.m_d.d = this_00;
  local_98.ptr = (int *)this_00;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver,(QPromise<QList<int>_> *)&local_98);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase((QPromiseBase<QList<int>_> *)&local_98);
  piVar2 = local_b0.ptr;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
         (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_c8.d = (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_d0.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_d0 = resolver.m_d.d;
  }
  local_d8.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_d0.d != (Data *)0x0) {
    LOCK();
    ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_e8 = resolver.m_d.d;
  local_80._M_unused._0_8_ = resolver.m_d.d;
  local_80._8_8_ = local_d0.d;
  local_48._M_unused._M_object = operator_new(0x18);
  *(void **)local_48._M_unused._0_8_ = local_80._M_unused._M_object;
  if ((Data *)local_80._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_80._M_unused._0_8_ = *local_80._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = local_80._8_8_;
  if ((Data *)local_80._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_80._8_8_ = *(int *)local_80._8_8_ + 1;
    UNLOCK();
  }
  *(code *)((long)local_48._M_unused._0_8_ + 0x10) = local_70;
  pcStack_30 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<int>,QtPromise::QPromise<QList<int>>::map<tst_qpromise_map::preserveOrder()::$_0>(tst_qpromise_map::preserveOrder()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1},QList<int>const&>
  ::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromise<QList<int>>::map<tst_qpromise_map::preserveOrder()::$_0>(tst_qpromise_map::preserveOrder()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1}const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)
  ::{lambda(QList<int>const&)#1}::~function((_lambda_QList<int>const___1_ *)local_80._M_pod_data);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)piVar2,
             (function<void_(const_QList<int>_&)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  piVar2 = local_b0.ptr;
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_80,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_e8,
             (QPromiseResolve<QList<int>_> *)&local_d0,in_R8);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)piVar2,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_d8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_e8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b090;
  bVar3 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_b0.ptr);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_b0.ptr);
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase((QPromiseBase<QList<int>_> *)&local_b0);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_60);
  local_98.d = (Data *)0x0;
  local_98.ptr = (int *)0x0;
  local_98.size = 0;
  waitForValue<QList<int>>((QList<int> *)&local_60,&p,(QList<int> *)&local_98);
  local_24[0] = 0xfb;
  local_24[1] = 0x1f5;
  local_24[2] = 0x65;
  args_00._M_len = 3;
  args_00._M_array = local_24;
  QList<int>::QList((QList<int> *)&local_b0,args_00);
  QTest::qCompare<int>
            ((QList<int> *)&local_60,(QList<int> *)&local_b0,"waitForValue(p, QVector<int>{})",
             "(QVector<int>{251, 501, 101})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_map.cpp"
             ,0x99);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_98);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&p.super_QPromiseBase<QList<int>_>);
  return;
}

Assistant:

void tst_qpromise_map::preserveOrder()
{
    auto p = QtPromise::resolve(QVector<int>{250, 500, 100}).map([](int v, ...) {
        return QtPromise::resolve(v + 1).delay(v);
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{251, 501, 101}));
}